

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int WebPPictureCopy(WebPPicture *src,WebPPicture *dst)

{
  WebPPicture *in_RSI;
  WebPPicture *in_RDI;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RDI == (WebPPicture *)0x0) || (in_RSI == (WebPPicture *)0x0)) {
    iVar1 = 0;
  }
  else if (in_RDI == in_RSI) {
    iVar1 = 1;
  }
  else {
    PictureGrabSpecs(in_RDI,in_RSI);
    iVar1 = WebPPictureAlloc(in_RSI);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (int)((ulong)in_RSI >> 0x20);
      if (in_RDI->use_argb == 0) {
        WebPCopyPlane((uint8_t *)dst,in_stack_fffffffffffffffc,(uint8_t *)in_RDI,iVar1,(int)in_RSI,0
                     );
        WebPCopyPlane((uint8_t *)dst,in_stack_fffffffffffffffc,(uint8_t *)in_RDI,
                      (int)((ulong)in_RSI >> 0x20),(int)in_RSI,0);
        WebPCopyPlane((uint8_t *)dst,in_stack_fffffffffffffffc,(uint8_t *)in_RDI,
                      (int)((ulong)in_RSI >> 0x20),(int)in_RSI,0);
        if (in_RSI->a != (uint8_t *)0x0) {
          WebPCopyPlane((uint8_t *)dst,in_stack_fffffffffffffffc,(uint8_t *)in_RDI,
                        (int)((ulong)in_RSI >> 0x20),(int)in_RSI,0);
        }
      }
      else {
        WebPCopyPlane((uint8_t *)dst,in_stack_fffffffffffffffc,(uint8_t *)in_RDI,iVar1,(int)in_RSI,0
                     );
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int WebPPictureCopy(const WebPPicture* src, WebPPicture* dst) {
  if (src == NULL || dst == NULL) return 0;
  if (src == dst) return 1;

  PictureGrabSpecs(src, dst);
  if (!WebPPictureAlloc(dst)) return 0;

  if (!src->use_argb) {
    WebPCopyPlane(src->y, src->y_stride,
                  dst->y, dst->y_stride, dst->width, dst->height);
    WebPCopyPlane(src->u, src->uv_stride, dst->u, dst->uv_stride,
                  HALVE(dst->width), HALVE(dst->height));
    WebPCopyPlane(src->v, src->uv_stride, dst->v, dst->uv_stride,
                  HALVE(dst->width), HALVE(dst->height));
    if (dst->a != NULL)  {
      WebPCopyPlane(src->a, src->a_stride,
                    dst->a, dst->a_stride, dst->width, dst->height);
    }
  } else {
    WebPCopyPlane((const uint8_t*)src->argb, 4 * src->argb_stride,
                  (uint8_t*)dst->argb, 4 * dst->argb_stride,
                  4 * dst->width, dst->height);
  }
  return 1;
}